

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::Logger::log(Logger *this)

{
  char *__s;
  size_t sVar1;
  ostream *in_RSI;
  
  __s = *(char **)&(this->super_ThreadSafe).field_0x8;
  if (__s != (char *)0x0) {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(in_RSI,__s,sVar1);
    return;
  }
  std::ios::clear((int)in_RSI + (int)*(undefined8 *)(*(long *)in_RSI + -0x18));
  return;
}

Assistant:

virtual inline void log(el::base::type::ostream_t& os) const {
    os << m_id.c_str();
  }